

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<unsigned_short>,ImPlot::TransformerLinLin>
               (GetterXsYs<unsigned_short> *getter,TransformerLinLin *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  ImPlotContext *pIVar5;
  long lVar6;
  ImPlotContext *pIVar7;
  int iVar8;
  ImPlotContext *gp;
  int iVar9;
  float fVar10;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_68;
  TransformerLinLin *local_60;
  undefined1 local_58 [8];
  TransformerLinLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar5 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar8 = getter->Count;
    local_48 = iVar8 + -1;
    lVar6 = (long)((getter->Offset % iVar8 + iVar8) % iVar8) * (long)getter->Stride;
    iVar8 = transformer->YAxis;
    IVar2 = GImPlot->PixelRange[iVar8].Min;
    local_3c.x = (float)(GImPlot->Mx *
                         ((double)*(ushort *)((long)getter->Xs + lVar6) - (pIVar4->XAxis).Range.Min)
                        + (double)IVar2.x);
    local_3c.y = (float)(GImPlot->My[iVar8] *
                         ((double)*(ushort *)((long)getter->Ys + lVar6) -
                         pIVar4->YAxis[iVar8].Range.Min) + (double)IVar2.y);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<unsigned_short>,ImPlot::TransformerLinLin>>
              ((LineStripRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::TransformerLinLin> *)
               local_58,DrawList,&pIVar4->PlotRect);
  }
  else {
    iVar8 = getter->Count;
    lVar6 = (long)((getter->Offset % iVar8 + iVar8) % iVar8) * (long)getter->Stride;
    iVar9 = transformer->YAxis;
    IVar2 = GImPlot->PixelRange[iVar9].Min;
    local_58._4_4_ =
         (undefined4)
         (GImPlot->My[iVar9] *
          ((double)*(ushort *)((long)getter->Ys + lVar6) - pIVar4->YAxis[iVar9].Range.Min) +
         (double)IVar2.y);
    local_58._0_4_ =
         (undefined4)
         (GImPlot->Mx * ((double)*(ushort *)((long)getter->Xs + lVar6) - (pIVar4->XAxis).Range.Min)
         + (double)IVar2.x);
    if (1 < iVar8) {
      iVar9 = 1;
      pIVar7 = GImPlot;
      local_60 = transformer;
      do {
        lVar6 = (long)(((getter->Offset + iVar9) % iVar8 + iVar8) % iVar8) * (long)getter->Stride;
        iVar3 = transformer->YAxis;
        IVar2 = pIVar7->PixelRange[iVar3].Min;
        local_68.x = (float)(pIVar7->Mx *
                             ((double)*(ushort *)((long)getter->Xs + lVar6) -
                             (pIVar7->CurrentPlot->XAxis).Range.Min) + (double)IVar2.x);
        local_68.y = (float)(pIVar7->My[iVar3] *
                             ((double)*(ushort *)((long)getter->Ys + lVar6) -
                             pIVar7->CurrentPlot->YAxis[iVar3].Range.Min) + (double)IVar2.y);
        pIVar4 = pIVar5->CurrentPlot;
        fVar10 = (float)local_58._4_4_;
        if (local_68.y <= (float)local_58._4_4_) {
          fVar10 = local_68.y;
        }
        if ((fVar10 < (pIVar4->PlotRect).Max.y) &&
           (fVar10 = (float)(~-(uint)(local_68.y <= (float)local_58._4_4_) & (uint)local_68.y |
                            -(uint)(local_68.y <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar10 && fVar10 != *pfVar1)) {
          fVar10 = (float)local_58._0_4_;
          if (local_68.x <= (float)local_58._0_4_) {
            fVar10 = local_68.x;
          }
          if ((fVar10 < (pIVar4->PlotRect).Max.x) &&
             (fVar10 = (float)(-(uint)(local_68.x <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(local_68.x <= (float)local_58._0_4_) & (uint)local_68.x),
             (pIVar4->PlotRect).Min.x <= fVar10 && fVar10 != (pIVar4->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_68,col,line_weight);
            iVar8 = getter->Count;
            pIVar7 = GImPlot;
            transformer = local_60;
          }
        }
        iVar9 = iVar9 + 1;
        local_58._0_4_ = local_68.x;
        local_58._4_4_ = local_68.y;
      } while (iVar9 < iVar8);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}